

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O2

int SUNLinSolSetup_Dense(SUNLinearSolver S,SUNMatrix A)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar3 = SUNDenseMatrix_Cols(A);
  uVar1 = *(undefined8 *)((long)S->content + 8);
  uVar4 = SUNDenseMatrix_Rows(A);
  uVar5 = SUNDenseMatrix_Columns(A);
  lVar6 = SUNDlsMat_denseGETRF(uVar3,uVar4,uVar5,uVar1);
  *(long *)((long)S->content + 0x10) = lVar6;
  iVar2 = 0x328;
  if (lVar6 < 1) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int SUNLinSolSetup_Dense(SUNLinearSolver S, SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);
  sunrealtype** A_cols;
  sunindextype* pivots;

  SUNAssert(A, SUN_ERR_ARG_CORRUPT);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  pivots = PIVOTS(S);
  SUNAssert(pivots, SUN_ERR_ARG_CORRUPT);
  SUNAssert(A_cols, SUN_ERR_ARG_CORRUPT);

  /* perform LU factorization of input matrix */
  LASTFLAG(S) = SUNDlsMat_denseGETRF(A_cols, SUNDenseMatrix_Rows(A),
                                     SUNDenseMatrix_Columns(A), pivots);

  /* store error flag (if nonzero, this row encountered zero-valued pivod) */
  if (LASTFLAG(S) > 0) { return (SUNLS_LUFACT_FAIL); }
  return SUN_SUCCESS;
}